

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Expression * __thiscall
wasm::IRBuilder::fixExtraOutput(IRBuilder *this,ScopeCtx *scope,Name label,Expression *curr)

{
  Index index;
  pointer pNVar1;
  char *pcVar2;
  string_view skipLabel;
  undefined4 index_00;
  size_t sVar3;
  TupleMake *right;
  size_t sVar4;
  LocalGet *pLVar5;
  Type TVar6;
  uint uVar7;
  ulong uVar8;
  Index j_1;
  uint index_01;
  Index j;
  Builder *this_00;
  Name trampolineLabel;
  Iterator __first;
  Iterator __last;
  string_view trampolineLabel_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 auStack_d8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elems;
  undefined1 local_b0 [8];
  anon_class_16_2_3efcb345 addTrampoline;
  _Storage<wasm::Type,_true> local_78;
  Type labelType;
  char *local_68;
  _Storage<wasm::Type,_true> local_50;
  Type extraType;
  Expression *curr_local;
  Type receivedType;
  
  local_b0 = (undefined1  [8])&extraType;
  addTrampoline.curr = (Expression **)this;
  extraType.id = (uintptr_t)curr;
  local_78._M_value = ScopeCtx::getLabelType(scope);
  this_00 = &this->builder;
  trampolineLabel_00 = (string_view)ZEXT816(0);
  uVar7 = 0;
  addTrampoline.this = (IRBuilder *)scope;
  labelType.id = (uintptr_t)this;
  do {
    local_68 = trampolineLabel_00._M_str;
    uVar8 = (ulong)uVar7;
    pNVar1 = (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(scope->outputLabels).
                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pNVar1 >> 4) <= uVar8) {
      if (local_68 != (char *)0x0) {
        TVar6 = ScopeCtx::getResultType(scope);
        fixExtraOutput::anon_class_16_2_3efcb345::operator()
                  ((anon_class_16_2_3efcb345 *)local_b0,TVar6,(Name)trampolineLabel_00,label);
      }
      return (Expression *)extraType.id;
    }
    pcVar2 = pNVar1[uVar8].super_IString.str._M_str;
    if (pcVar2 != (char *)0x0) {
      sVar4 = pNVar1[uVar8].super_IString.str._M_len;
      index = (scope->outputLocals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8];
      local_50._M_value = Function::getLocalType(*(Function **)(labelType.id + 8),index);
      sVar3 = wasm::Type::size(&local_50._M_value);
      __last = wasm::Type::end(&local_78._M_value);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar3;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)&local_78;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_d8,__first,__last,
                 (allocator_type *)&receivedType);
      wasm::Type::Type((Type *)&curr_local,(Tuple *)auStack_d8);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8);
      skipLabel = (string_view)label.super_IString.str;
      if (((*(char *)&(addTrampoline.this)->binaryPos == '\x05') &&
          ((addTrampoline.this)->wasm != (Module *)0x0)) && (local_68 == (char *)0x0)) {
        trampolineLabel_00 = (string_view)makeFresh((IRBuilder *)labelType.id,label,0);
        skipLabel = trampolineLabel_00;
      }
      trampolineLabel.super_IString.str._M_str = pcVar2;
      trampolineLabel.super_IString.str._M_len = sVar4;
      fixExtraOutput::anon_class_16_2_3efcb345::operator()
                ((anon_class_16_2_3efcb345 *)local_b0,(Type)curr_local,trampolineLabel,
                 (Name)skipLabel);
      TVar6 = extraType;
      if (curr_local == (Expression *)0x0) {
        if (local_50 != local_78) {
          __assert_fail("extraType == labelType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                        ,0x4be,
                        "Expression *wasm::IRBuilder::fixExtraOutput(ScopeCtx &, Name, Expression *)"
                       );
        }
        pLVar5 = Builder::makeLocalGet(this_00,index,local_50._M_value.id);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)local_50;
        extraType.id = (uintptr_t)
                       Builder::makeSequence(this_00,TVar6.id,(Expression *)pLVar5,type_00);
        scope = (ScopeCtx *)addTrampoline.this;
      }
      else {
        addScratchLocal((Result<unsigned_int> *)auStack_d8,(IRBuilder *)labelType.id,
                        (Type)curr_local);
        index_00 = auStack_d8._0_4_;
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)auStack_d8);
        extraType.id = (uintptr_t)Builder::makeLocalSet(this_00,index_00,extraType.id);
        elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_d8 = (undefined1  [8])0x0;
        elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if (((ulong)local_50 < 2) || ((6 < (ulong)local_50 & local_50._0_1_) != 0)) {
          uVar8 = 0;
          while( true ) {
            sVar4 = wasm::Type::size(&local_50._M_value);
            if (sVar4 <= uVar8) break;
            pLVar5 = Builder::makeLocalGet(this_00,index,local_50._M_value.id);
            receivedType.id =
                 (uintptr_t)Builder::makeTupleExtract(this_00,(Expression *)pLVar5,(Index)uVar8);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                       (Expression **)&receivedType);
            uVar8 = (ulong)((Index)uVar8 + 1);
          }
        }
        else {
          receivedType.id = (uintptr_t)Builder::makeLocalGet(this_00,index,local_50._M_value.id);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                     (Expression **)&receivedType);
        }
        if ((curr_local < (Expression *)0x2) ||
           (((Expression *)0x6 < curr_local & (byte)curr_local) != 0)) {
          for (index_01 = 0; sVar4 = wasm::Type::size((Type *)&curr_local), index_01 < sVar4;
              index_01 = index_01 + 1) {
            pLVar5 = Builder::makeLocalGet(this_00,index_00,(Type)curr_local);
            receivedType.id =
                 (uintptr_t)Builder::makeTupleExtract(this_00,(Expression *)pLVar5,index_01);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                       (Expression **)&receivedType);
          }
        }
        else {
          receivedType.id = (uintptr_t)Builder::makeLocalGet(this_00,index_00,(Type)curr_local);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                     (Expression **)&receivedType);
        }
        TVar6.id = extraType.id;
        right = Builder::
                makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                          (this_00,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)auStack_d8);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = local_78;
        extraType.id = (uintptr_t)Builder::makeSequence(this_00,TVar6.id,(Expression *)right,type);
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   auStack_d8);
        scope = (ScopeCtx *)addTrampoline.this;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

Expression*
IRBuilder::fixExtraOutput(ScopeCtx& scope, Name label, Expression* curr) {
  // Add a trampoline branch target. Reuse unnamed blocks.
  auto addTrampoline =
    [&](Type receivedType, Name trampolineLabel, Name skipLabel) {
      if (auto* block = curr->dynCast<Block>(); block && !block->name) {
        block->name = trampolineLabel;
        if (block->list.back()->type == Type::none) {
          block->list.push_back(builder.makeBreak(skipLabel));
        } else {
          block->list.back() = builder.makeBreak(skipLabel, block->list.back());
        }
        block->type = receivedType;
      } else {
        assert(curr->type != Type::none);
        curr = builder.makeBlock(
          trampolineLabel, {builder.makeBreak(skipLabel, curr)}, receivedType);
      }
    };

  auto labelType = scope.getLabelType();
  Name fallthroughLabel;
  for (Index i = 0; i < scope.outputLabels.size(); ++i) {
    auto extraLabel = scope.outputLabels[i];
    if (!extraLabel) {
      continue;
    }

    auto extraLocal = scope.outputLocals[i];
    auto extraType = func->getLocalType(extraLocal);
    Type receivedType =
      Tuple(labelType.begin() + extraType.size(), labelType.end());

    // For normal blocks, the original fallthrough values can be sent to the
    // scope label and they will end up in the right place, but for loops, the
    // fallthrough values should _not_ go to the scope label. We will add a new
    // branch target at the end to send the fallthrough values to.
    if (scope.getLoop() && !fallthroughLabel) {
      fallthroughLabel = makeFresh(label);
      addTrampoline(receivedType, extraLabel, fallthroughLabel);
    } else {
      addTrampoline(receivedType, extraLabel, label);
    }

    // If all the received values are in the scratch local, just fetch them out.
    if (receivedType == Type::none) {
      assert(extraType == labelType);
      curr = builder.makeSequence(
        curr, builder.makeLocalGet(extraLocal, extraType), extraType);
      continue;
    }

    // Otherwise, we have to reorder the received values past the extra values
    // from the scratch local using an additional scratch local.
    auto receivedLocal = *addScratchLocal(receivedType);
    curr = builder.makeLocalSet(receivedLocal, curr);

    // Concatenate the extra values and received values into a tuple.
    std::vector<Expression*> elems;
    if (extraType.isSingle()) {
      elems.push_back(builder.makeLocalGet(extraLocal, extraType));
    } else {
      for (Index j = 0; j < extraType.size(); ++j) {
        elems.push_back(builder.makeTupleExtract(
          builder.makeLocalGet(extraLocal, extraType), j));
      }
    }
    if (receivedType.isSingle()) {
      elems.push_back(builder.makeLocalGet(receivedLocal, receivedType));
    } else {
      for (Index j = 0; j < receivedType.size(); ++j) {
        elems.push_back(builder.makeTupleExtract(
          builder.makeLocalGet(receivedLocal, receivedType), j));
      }
    }

    curr = builder.makeSequence(curr, builder.makeTupleMake(elems), labelType);
  }

  if (fallthroughLabel) {
    // The loop fallthrough values need to propagate to one final trampoline.
    addTrampoline(scope.getResultType(), fallthroughLabel, label);
  }
  return curr;
}